

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

PtrTokenOrSyntax * __thiscall
slang::syntax::ForeachLoopListSyntax::getChildPtr
          (PtrTokenOrSyntax *__return_storage_ptr__,ForeachLoopListSyntax *this,size_t index)

{
  __index_type *p_Var1;
  
  switch(this) {
  case (ForeachLoopListSyntax *)0x0:
    p_Var1 = (__index_type *)
             ((long)&__return_storage_ptr__[1].
                     super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Copy_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Variant_storage_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
             + 8);
    break;
  case (ForeachLoopListSyntax *)0x1:
    return (PtrTokenOrSyntax *)
           *(__index_type **)
            ((long)&__return_storage_ptr__[2].
                    super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                    super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                    super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                    super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                    super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                    super__Copy_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                    super__Variant_storage_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
            + 8);
  case (ForeachLoopListSyntax *)0x2:
    p_Var1 = (__index_type *)(__return_storage_ptr__ + 3);
    break;
  case (ForeachLoopListSyntax *)0x3:
    return (PtrTokenOrSyntax *)
           (__index_type *)
           ((long)&__return_storage_ptr__[4].
                   super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                   super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                   super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                   super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                   super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                   super__Copy_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                   super__Variant_storage_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
           + 8);
  case (ForeachLoopListSyntax *)0x4:
    p_Var1 = (__index_type *)
             ((long)&__return_storage_ptr__[7].
                     super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Copy_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Variant_storage_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
             + 8);
    break;
  case (ForeachLoopListSyntax *)0x5:
    p_Var1 = (__index_type *)
             ((long)&__return_storage_ptr__[8].
                     super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Copy_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Variant_storage_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
             + 8);
    break;
  default:
    return (PtrTokenOrSyntax *)0x0;
  }
  return (PtrTokenOrSyntax *)p_Var1;
}

Assistant:

PtrTokenOrSyntax ForeachLoopListSyntax::getChildPtr(size_t index) {
    switch (index) {
        case 0: return &openParen;
        case 1: return arrayName.get();
        case 2: return &openBracket;
        case 3: return &loopVariables;
        case 4: return &closeBracket;
        case 5: return &closeParen;
        default: return nullptr;
    }
}